

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void slang::ast::InstanceSymbol::fromSyntax
               (Compilation *comp,HierarchyInstantiationSyntax *syntax,ASTContext *context,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets,BindDirectiveInfo *bindInfo
               ,SyntaxNode *overrideSyntax)

{
  Token *this;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  SymbolKind SVar1;
  pointer ppAVar2;
  size_t sVar3;
  Compilation *this_01;
  size_t sVar4;
  uint uVar5;
  string_view sVar6;
  string_view sVar7;
  undefined4 uVar8;
  ResolvedConfig *pRVar9;
  byte bVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  byte bVar14;
  uint uVar15;
  CheckerSymbol *checker;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_02;
  Scope *pSVar16;
  Symbol *pSVar17;
  uint64_t uVar18;
  HierarchicalInstanceSyntax *this_03;
  Scope *pSVar19;
  basic_string_view<char,_std::char_traits<char>_> *pbVar20;
  ulong uVar21;
  char *pcVar22;
  type *defResult_3;
  string_view *sv;
  __extent_storage<18446744073709551615UL> configBlock;
  ConfigRule *defResult_00;
  ConfigRule *pCVar23;
  __extent_storage<18446744073709551615UL> args;
  char *pcVar24;
  size_type sVar26;
  size_type sVar27;
  bitmask<slang::ast::InstanceFlags> flags;
  basic_string_view<char,_std::char_traits<char>_> *pbVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  byte bVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  byte bVar46;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail;
  SourceRange SVar47;
  string_view sVar48;
  string_view sVar49;
  bool inChecker;
  TimeTraceScope timeScope;
  HierarchyOverrideNode *local_410;
  ResolvedConfig *resolvedConfig;
  Symbol *sym;
  __extent_storage<18446744073709551615UL> _Stack_3d0;
  ConfigRule *local_3c8;
  HierarchicalInstanceSyntax *local_3c0;
  string_view defName;
  undefined8 local_3a8;
  ConfigRule *local_390;
  DefinitionSymbol *owningDefinition;
  string_view local_368;
  const_iterator __begin0;
  Symbol *local_338;
  anon_class_72_9_2532bcb6 createInstances;
  DefinitionLookupResult defResult_2;
  DefinitionLookupResult defResult;
  Symbol local_278;
  char local_238;
  char cStack_237;
  char cStack_236;
  byte bStack_235;
  char cStack_234;
  char cStack_233;
  char cStack_232;
  byte bStack_231;
  char cStack_230;
  char cStack_22f;
  char cStack_22e;
  byte bStack_22d;
  char cStack_22c;
  char cStack_22b;
  char cStack_22a;
  byte bStack_229;
  char local_228;
  char cStack_227;
  char cStack_226;
  byte bStack_225;
  char cStack_224;
  char cStack_223;
  char cStack_222;
  byte bStack_221;
  char cStack_220;
  char cStack_21f;
  char cStack_21e;
  byte bStack_21d;
  char cStack_21c;
  char cStack_21b;
  char cStack_21a;
  byte bStack_219;
  char local_218;
  char cStack_217;
  char cStack_216;
  byte bStack_215;
  char cStack_214;
  char cStack_213;
  char cStack_212;
  byte bStack_211;
  char cStack_210;
  char cStack_20f;
  char cStack_20e;
  byte bStack_20d;
  char cStack_20c;
  char cStack_20b;
  char cStack_20a;
  byte bStack_209;
  char local_208;
  char cStack_207;
  char cStack_206;
  byte bStack_205;
  char cStack_204;
  char cStack_203;
  char cStack_202;
  byte bStack_201;
  char cStack_200;
  char cStack_1ff;
  char cStack_1fe;
  byte bStack_1fd;
  char cStack_1fc;
  char cStack_1fb;
  char cStack_1fa;
  byte bStack_1f9;
  SmallVector<const_slang::ast::Symbol_*,_5UL> parentStack;
  string_view rootName;
  InstanceBuilder builder;
  InstanceBuilder *pIVar25;
  
  this = &syntax->type;
  defName = parsing::Token::valueText(this);
  builder.implicitNetNames.super_Storage.buffer._0_8_ = &defName;
  pIVar25 = &builder;
  detail.callable = (intptr_t)pIVar25;
  detail.callback =
       function_ref<std::__cxx11::string()>::
       callback_fn<slang::ast::InstanceSymbol::fromSyntax(slang::ast::Compilation&,slang::syntax::HierarchyInstantiationSyntax_const&,slang::ast::ASTContext_const&,slang::SmallVectorBase<slang::ast::Symbol_const*>&,slang::SmallVectorBase<slang::ast::Symbol_const*>&,slang::ast::BindDirectiveInfo_const*,slang::syntax::SyntaxNode_const*)::__0>
  ;
  sVar49._M_str = "createInstances";
  sVar49._M_len = 0xf;
  TimeTraceScope::TimeTraceScope(&timeScope,sVar49,detail);
  inChecker = false;
  pSVar16 = (context->scope).ptr;
  bVar10 = 0;
  pSVar19 = pSVar16;
  do {
    pSVar17 = pSVar19->thisSym;
    SVar1 = pSVar17->kind;
    if (SVar1 == GenerateBlock) {
      bVar10 = bVar10 | *(byte *)((long)&pSVar17[1].originatingSyntax + 4);
    }
    else if (SVar1 == CheckerInstanceBody) {
      inChecker = true;
      bVar10 = bVar10 | *(byte *)((long)&pSVar17[2].name._M_str + 5) & 5;
      pSVar17 = (Symbol *)pSVar17[1].originatingSyntax;
    }
    else if (SVar1 == InstanceBody) {
      bVar10 = bVar10 | (byte)pSVar17[2].name._M_len & 5;
      goto LAB_002945a1;
    }
    pSVar19 = pSVar17->parentScope;
  } while (pSVar19 != (Scope *)0x0);
  pSVar17 = (Symbol *)0x0;
LAB_002945a1:
  if ((bVar10 & 1) != 0) {
    UninstantiatedDefSymbol::fromSyntax(comp,syntax,context,results,implicitNets);
    goto LAB_002950f5;
  }
  flags.m_bits = bVar10 | 2;
  if (bindInfo == (BindDirectiveInfo *)0x0) {
    flags.m_bits = bVar10;
  }
  sVar48._M_str = (char *)0x2;
  sVar48._M_len = (size_t)defName._M_str;
  pCVar23 = (ConfigRule *)defName._M_len;
  checker = (CheckerSymbol *)
            Lookup::unqualified((Lookup *)pSVar16,(Scope *)defName._M_len,sVar48,
                                (bitmask<slang::ast::LookupFlags>)(underlying_type)pIVar25);
  if ((checker != (CheckerSymbol *)0x0) && ((checker->super_Symbol).kind == Checker)) {
    CheckerInstanceSymbol::fromSyntax(checker,syntax,context,results,implicitNets,flags);
    goto LAB_002950f5;
  }
  owningDefinition = (DefinitionSymbol *)0x0;
  resolvedConfig = (ResolvedConfig *)0x0;
  if (pSVar17 == (Symbol *)0x0) {
    local_410 = (HierarchyOverrideNode *)0x0;
  }
  else {
    owningDefinition = (DefinitionSymbol *)pSVar17[2].name._M_str;
    if (*(long *)(pSVar17 + 2) == 0) {
      local_410 = (HierarchyOverrideNode *)0x0;
    }
    else {
      local_410 = anon_unknown.dwarf_beab97::findParentOverrideNode((context->scope).ptr);
    }
    if (pSVar17[1].originatingSyntax != (SyntaxNode *)0x0) {
      resolvedConfig = (ResolvedConfig *)pSVar17[1].originatingSyntax[3].previewNode;
    }
    if ((flags.m_bits & 2) != 0) {
      if ((flags.m_bits & 4) != 0) {
        SVar47 = parsing::Token::range(this);
        ASTContext::addDiag(context,(DiagCode)0xb0006,SVar47);
        goto LAB_002950f5;
      }
      flags.m_bits = flags.m_bits | 4;
    }
  }
  ppAVar2 = (syntax->super_MemberSyntax).attributes.
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  sVar3 = (syntax->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::SmallSet(&builder.implicitNetNames);
  builder.netType = Scope::getDefaultNetType((context->scope).ptr);
  sVar49 = defName;
  pRVar9 = resolvedConfig;
  builder.path.super_SmallVectorBase<unsigned_int>.data_ =
       (pointer)builder.path.super_SmallVectorBase<unsigned_int>.firstElement;
  pSVar16 = (context->scope).ptr;
  builder.comp = pSVar16->compilation;
  builder.path.super_SmallVectorBase<unsigned_int>.len = 0;
  builder.definition = (DefinitionSymbol *)0x0;
  builder.paramBuilder = (ParameterBuilder *)0x0;
  builder.parentOverrideNode = local_410;
  builder.resolvedConfig = (ResolvedConfig *)0x0;
  builder.newConfigRoot = (ConfigBlockSymbol *)0x0;
  builder.overrideSyntax = overrideSyntax;
  builder.path.super_SmallVectorBase<unsigned_int>.cap = 10;
  createInstances.builder = &builder;
  createInstances.owningDefinition = &owningDefinition;
  createInstances.inChecker = &inChecker;
  createInstances.resolvedConfig = &resolvedConfig;
  createInstances.comp = comp;
  createInstances.syntax = syntax;
  createInstances.context = context;
  createInstances.results = results;
  createInstances.implicitNets = implicitNets;
  builder.context = context;
  builder.implicitNets = implicitNets;
  builder.attributes._M_ptr = ppAVar2;
  builder.attributes._M_extent._M_extent_value = sVar3;
  builder.flags.m_bits = flags.m_bits;
  if (bindInfo == (BindDirectiveInfo *)0x0) {
    if (resolvedConfig != (ResolvedConfig *)0x0) {
      defResult.definition = &local_278;
      defResult.configRoot = (ConfigBlockSymbol *)0x0;
      defResult.configRule = (ConfigRule *)0x2;
      this_02 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                ConfigBlockSymbol::getInstanceOverrides(resolvedConfig->useConfig);
      if (*(long *)(this_02 + 0x28) != 0) {
        pSVar16 = (context->scope).ptr;
        parentStack.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ =
             (pointer)parentStack.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement;
        parentStack.super_SmallVectorBase<const_slang::ast::Symbol_*>.len = 0;
        parentStack.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = 5;
        do {
          pSVar17 = pSVar16->thisSym;
          if (pSVar17->kind == InstanceBody) {
            pSVar17 = (Symbol *)pSVar17[1].originatingSyntax;
          }
          sym = pSVar17;
          SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*const&>
                    ((SmallVectorBase<slang::ast::Symbol_const*> *)&parentStack,&sym);
          pSVar16 = sym->parentScope;
        } while ((pSVar16 != (Scope *)0x0) && (pRVar9->rootInstance != (InstanceSymbol *)sym));
        pSVar17 = parentStack.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_
                  [parentStack.super_SmallVectorBase<const_slang::ast::Symbol_*>.len - 1];
        if (pSVar17->kind == Instance) {
          pSVar17 = *(Symbol **)(pSVar17[1].name._M_str + 0x90);
        }
        rootName._M_len = (pSVar17->name)._M_len;
        rootName._M_str = (pSVar17->name)._M_str;
        uVar18 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           (this_02,(basic_string_view<char,_std::char_traits<char>_> *)&rootName);
        pCVar23 = (ConfigRule *)(uVar18 >> ((byte)*this_02 & 0x3f));
        lVar29 = (uVar18 & 0xff) * 4;
        cVar33 = (&UNK_004a00ac)[lVar29];
        cVar34 = (&UNK_004a00ad)[lVar29];
        cVar35 = (&UNK_004a00ae)[lVar29];
        bVar10 = (&UNK_004a00af)[lVar29];
        uVar21 = 0;
        do {
          pcVar22 = (char *)(*(long *)(this_02 + 0x10) + (long)pCVar23 * 0x10);
          local_208 = *pcVar22;
          cStack_207 = pcVar22[1];
          cStack_206 = pcVar22[2];
          bStack_205 = pcVar22[3];
          cStack_204 = pcVar22[4];
          cStack_203 = pcVar22[5];
          cStack_202 = pcVar22[6];
          bStack_201 = pcVar22[7];
          cStack_200 = pcVar22[8];
          cStack_1ff = pcVar22[9];
          cStack_1fe = pcVar22[10];
          bStack_1fd = pcVar22[0xb];
          cStack_1fc = pcVar22[0xc];
          cStack_1fb = pcVar22[0xd];
          cStack_1fa = pcVar22[0xe];
          bVar12 = pcVar22[0xf];
          auVar30[0] = -(local_208 == cVar33);
          auVar30[1] = -(cStack_207 == cVar34);
          auVar30[2] = -(cStack_206 == cVar35);
          auVar30[3] = -(bStack_205 == bVar10);
          auVar30[4] = -(cStack_204 == cVar33);
          auVar30[5] = -(cStack_203 == cVar34);
          auVar30[6] = -(cStack_202 == cVar35);
          auVar30[7] = -(bStack_201 == bVar10);
          auVar30[8] = -(cStack_200 == cVar33);
          auVar30[9] = -(cStack_1ff == cVar34);
          auVar30[10] = -(cStack_1fe == cVar35);
          auVar30[0xb] = -(bStack_1fd == bVar10);
          auVar30[0xc] = -(cStack_1fc == cVar33);
          auVar30[0xd] = -(cStack_1fb == cVar34);
          auVar30[0xe] = -(cStack_1fa == cVar35);
          auVar30[0xf] = -(bVar12 == bVar10);
          uVar15 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe);
          bStack_1f9 = bVar12;
          if (uVar15 != 0) {
            local_3a8 = *(long *)(this_02 + 0x10) + (long)pCVar23 * 0x10;
            lVar29 = *(long *)(this_02 + 0x18);
            do {
              uVar5 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                }
              }
              pbVar20 = (basic_string_view<char,_std::char_traits<char>_> *)
                        ((ulong)uVar5 * 0x48 + lVar29 + (long)pCVar23 * 0x438);
              args._M_extent_value = (size_t)&rootName;
              bVar11 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)this_02,
                                  (basic_string_view<char,_std::char_traits<char>_> *)&rootName,
                                  pbVar20);
              sVar26 = parentStack.super_SmallVectorBase<const_slang::ast::Symbol_*>.len;
              if (bVar11) goto LAB_00294aa1;
              uVar15 = uVar15 - 1 & uVar15;
            } while (uVar15 != 0);
            bVar12 = *(byte *)((long)&(((ConfigBlockSymbol *)local_3a8)->super_Symbol).name._M_len +
                              7);
          }
          sVar6._M_str = local_368._M_str;
          sVar6._M_len = local_368._M_len;
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & bVar12) == 0) break;
          lVar29 = uVar21 + 1;
          uVar21 = uVar21 + 1;
          pCVar23 = (ConfigRule *)
                    ((long)&((DefinitionLookupResult *)&pCVar23->liblist)->definition + lVar29 &
                    *(ulong *)(this_02 + 8));
          local_368 = sVar6;
        } while (uVar21 <= *(ulong *)(this_02 + 8));
        goto LAB_00294fff;
      }
      goto LAB_0029500c;
    }
    goto LAB_00295077;
  }
  SVar47 = parsing::Token::range(this);
  Compilation::getDefinition(&defResult,comp,sVar49,pSVar16,SVar47,bindInfo);
  if ((defResult.configRoot != (ConfigBlockSymbol *)0x0) &&
     (resolvedConfig =
           BumpAllocator::
           emplace<slang::ast::ResolvedConfig,slang::ast::ConfigBlockSymbol_const&,slang::ast::InstanceSymbol_const&>
                     (&comp->super_BumpAllocator,defResult.configRoot,
                      (InstanceSymbol *)pSVar17[1].originatingSyntax),
     bindInfo->isNewConfigRoot == false)) {
    defResult.configRoot = (ConfigBlockSymbol *)0x0;
    sVar3 = (bindInfo->liblist)._M_extent._M_extent_value;
    (resolvedConfig->liblist)._M_ptr = (bindInfo->liblist)._M_ptr;
    (resolvedConfig->liblist)._M_extent._M_extent_value = sVar3;
  }
  fromSyntax::anon_class_72_9_2532bcb6::operator()
            (&createInstances,&defResult,(HierarchicalInstanceSyntax *)0x0);
LAB_002950e8:
  anon_unknown.dwarf_beab97::InstanceBuilder::~InstanceBuilder(&builder);
LAB_002950f5:
  TimeTraceScope::~TimeTraceScope(&timeScope);
  return;
LAB_00294aa1:
  pbVar28 = pbVar20;
  this_00 = pbVar28 + 1;
  sVar27 = sVar26 - 1;
  if (sVar27 == 0) {
    pCVar23 = (ConfigRule *)args._M_extent_value;
    if (pbVar28[3]._M_str != (char *)0x0) {
      this_01 = ((context->scope).ptr)->compilation;
      __begin0.index = 0;
      sVar3 = (syntax->instances).elements._M_extent._M_extent_value;
      bVar11 = false;
      __begin0.list = &syntax->instances;
      for (; (__begin0.list != &syntax->instances ||
             (pCVar23 = (ConfigRule *)args._M_extent_value, __begin0.index != sVar3 + 1 >> 1));
          __begin0.index = __begin0.index + 1) {
        this_03 = slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
                  iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>::dereference
                            (&__begin0);
        if (this_03->decl == (InstanceNameSyntax *)0x0) {
          sVar48 = (string_view)(ZEXT816(0x489e8d) << 0x40);
        }
        else {
          sVar48 = parsing::Token::valueText(&this_03->decl->name);
        }
        local_368 = sVar48;
        uVar18 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            this_00,&local_368);
        uVar21 = uVar18 >> ((byte)this_00->_M_len & 0x3f);
        lVar29 = (uVar18 & 0xff) * 4;
        cVar33 = (&UNK_004a00ac)[lVar29];
        cVar34 = (&UNK_004a00ad)[lVar29];
        cVar35 = (&UNK_004a00ae)[lVar29];
        bVar10 = (&UNK_004a00af)[lVar29];
        pcVar22 = (char *)0x0;
        cVar36 = cVar33;
        cVar37 = cVar34;
        cVar38 = cVar35;
        bVar12 = bVar10;
        cVar39 = cVar33;
        cVar40 = cVar34;
        cVar41 = cVar35;
        bVar42 = bVar10;
        cVar43 = cVar33;
        cVar44 = cVar34;
        cVar45 = cVar35;
        bVar46 = bVar10;
        do {
          sVar4 = pbVar28[2]._M_len;
          pcVar24 = (char *)(sVar4 + uVar21 * 0x10);
          local_228 = *pcVar24;
          cStack_227 = pcVar24[1];
          cStack_226 = pcVar24[2];
          bStack_225 = pcVar24[3];
          cStack_224 = pcVar24[4];
          cStack_223 = pcVar24[5];
          cStack_222 = pcVar24[6];
          bStack_221 = pcVar24[7];
          cStack_220 = pcVar24[8];
          cStack_21f = pcVar24[9];
          cStack_21e = pcVar24[10];
          bStack_21d = pcVar24[0xb];
          cStack_21c = pcVar24[0xc];
          cStack_21b = pcVar24[0xd];
          cStack_21a = pcVar24[0xe];
          bVar14 = pcVar24[0xf];
          auVar32[0] = -(local_228 == cVar33);
          auVar32[1] = -(cStack_227 == cVar34);
          auVar32[2] = -(cStack_226 == cVar35);
          auVar32[3] = -(bStack_225 == bVar10);
          auVar32[4] = -(cStack_224 == cVar36);
          auVar32[5] = -(cStack_223 == cVar37);
          auVar32[6] = -(cStack_222 == cVar38);
          auVar32[7] = -(bStack_221 == bVar12);
          auVar32[8] = -(cStack_220 == cVar39);
          auVar32[9] = -(cStack_21f == cVar40);
          auVar32[10] = -(cStack_21e == cVar41);
          auVar32[0xb] = -(bStack_21d == bVar42);
          auVar32[0xc] = -(cStack_21c == cVar43);
          auVar32[0xd] = -(cStack_21b == cVar44);
          auVar32[0xe] = -(cStack_21a == cVar45);
          auVar32[0xf] = -(bVar14 == bVar46);
          uVar15 = (uint)(ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe);
          bStack_219 = bVar14;
          if (uVar15 != 0) {
            pcVar24 = pbVar28[2]._M_str;
            local_238 = cVar33;
            cStack_237 = cVar34;
            cStack_236 = cVar35;
            bStack_235 = bVar10;
            cStack_234 = cVar36;
            cStack_233 = cVar37;
            cStack_232 = cVar38;
            bStack_231 = bVar12;
            cStack_230 = cVar39;
            cStack_22f = cVar40;
            cStack_22e = cVar41;
            bStack_22d = bVar42;
            cStack_22c = cVar43;
            cStack_22b = cVar44;
            cStack_22a = cVar45;
            bStack_229 = bVar46;
            do {
              uVar5 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                }
              }
              pbVar20 = (basic_string_view<char,_std::char_traits<char>_> *)
                        (pcVar24 + (ulong)uVar5 * 0x48 + uVar21 * 0x438);
              bVar13 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)this_00,&local_368,pbVar20);
              if (bVar13) {
                pCVar23 = (ConfigRule *)pbVar20[4]._M_len;
                if (pCVar23 == (ConfigRule *)0x0) {
                  bVar13 = false;
                  goto LAB_00294eb8;
                }
                pSVar16 = (context->scope).ptr;
                SVar47 = slang::syntax::SyntaxNode::sourceRange(&this_03->super_SyntaxNode);
                Compilation::getDefinition
                          (&defResult_2,this_01,sVar49,pSVar16,pCVar23,SVar47,(DiagCode)0xcf0006);
                local_3c8 = defResult_2.configRule;
                _Stack_3d0._M_extent_value = (size_t)defResult_2.configRoot;
                sym = defResult_2.definition;
                args._M_extent_value = (size_t)&sym;
                local_3c0 = this_03;
                SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                ::
                emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                          ((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                            *)&defResult,
                           (pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
                            *)args._M_extent_value);
                bVar13 = false;
                configBlock._M_extent_value = (size_t)defResult_2.configRoot;
                goto LAB_00294f90;
              }
              uVar15 = uVar15 - 1 & uVar15;
            } while (uVar15 != 0);
            bVar14 = *(byte *)(sVar4 + uVar21 * 0x10 + 0xf);
            cVar33 = local_238;
            cVar34 = cStack_237;
            cVar35 = cStack_236;
            bVar10 = bStack_235;
            cVar36 = cStack_234;
            cVar37 = cStack_233;
            cVar38 = cStack_232;
            bVar12 = bStack_231;
            cVar39 = cStack_230;
            cVar40 = cStack_22f;
            cVar41 = cStack_22e;
            bVar42 = bStack_22d;
            cVar43 = cStack_22c;
            cVar44 = cStack_22b;
            cVar45 = cStack_22a;
            bVar46 = bStack_229;
          }
          bVar13 = true;
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & bVar14) == 0) {
            pbVar20 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
            bVar13 = true;
            goto LAB_00294eb8;
          }
          pcVar24 = pcVar22 + uVar21 + 1;
          pcVar22 = pcVar22 + 1;
          uVar21 = (ulong)pcVar24 & (ulong)pbVar28[1]._M_str;
        } while (pcVar22 <= pbVar28[1]._M_str);
        pbVar20 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
LAB_00294eb8:
        args._M_extent_value = (size_t)&sym;
        if (!bVar11) {
          pSVar16 = (context->scope).ptr;
          SVar47 = parsing::Token::range(this);
          Compilation::getDefinition
                    ((DefinitionLookupResult *)args._M_extent_value,this_01,sVar49,pSVar16,SVar47,
                     (DiagCode)0xcf0006);
          local_338 = sym;
          local_390 = local_3c8;
          local_3a8 = _Stack_3d0._M_extent_value;
        }
        _Stack_3d0._M_extent_value = local_3a8;
        sym = local_338;
        local_3c8 = local_390;
        local_3c0 = this_03;
        SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
        ::
        emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                  ((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                    *)&defResult,
                   (pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
                    *)args._M_extent_value);
        bVar11 = true;
        configBlock._M_extent_value = local_3a8;
LAB_00294f90:
        if ((!bVar13) &&
           ((ConfigBlockSymbol *)configBlock._M_extent_value != (ConfigBlockSymbol *)0x0)) {
          _sym = (span<const_slang::SourceLibrary_*const,_18446744073709551615UL>)
                 boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                 ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                          *)(pbVar20 + 1));
          while (args._M_extent_value = _Stack_3d0._M_extent_value,
                (ConfigRule *)_Stack_3d0._M_extent_value != (ConfigRule *)0x0) {
            anon_unknown.dwarf_beab97::checkForInvalidNestedConfigNodes
                      (context,(InstanceOverride *)(_Stack_3d0._M_extent_value + 0x10),
                       (ConfigBlockSymbol *)configBlock._M_extent_value);
            boost::unordered::detail::foa::
            table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
            ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                         *)&sym);
          }
        }
      }
    }
  }
  else {
    sv = &parentStack.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_[sVar26 - 2]->name;
    uVar18 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_00
                        ,sv);
    pCVar23 = (ConfigRule *)(uVar18 >> ((byte)pbVar28[1]._M_len & 0x3f));
    lVar29 = (uVar18 & 0xff) * 4;
    cVar33 = (&UNK_004a00ac)[lVar29];
    cVar34 = (&UNK_004a00ad)[lVar29];
    cVar35 = (&UNK_004a00ae)[lVar29];
    bVar10 = (&UNK_004a00af)[lVar29];
    uVar8 = *(undefined4 *)(&UNK_004a00ac + lVar29);
    pcVar22 = (char *)0x0;
    do {
      sVar3 = pbVar28[2]._M_len;
      pcVar24 = (char *)(sVar3 + (long)pCVar23 * 0x10);
      local_218 = *pcVar24;
      cStack_217 = pcVar24[1];
      cStack_216 = pcVar24[2];
      bStack_215 = pcVar24[3];
      cStack_214 = pcVar24[4];
      cStack_213 = pcVar24[5];
      cStack_212 = pcVar24[6];
      bStack_211 = pcVar24[7];
      cStack_210 = pcVar24[8];
      cStack_20f = pcVar24[9];
      cStack_20e = pcVar24[10];
      bStack_20d = pcVar24[0xb];
      cStack_20c = pcVar24[0xc];
      cStack_20b = pcVar24[0xd];
      cStack_20a = pcVar24[0xe];
      bVar12 = pcVar24[0xf];
      auVar31[0] = -(local_218 == cVar33);
      auVar31[1] = -(cStack_217 == cVar34);
      auVar31[2] = -(cStack_216 == cVar35);
      auVar31[3] = -(bStack_215 == bVar10);
      auVar31[4] = -(cStack_214 == cVar33);
      auVar31[5] = -(cStack_213 == cVar34);
      auVar31[6] = -(cStack_212 == cVar35);
      auVar31[7] = -(bStack_211 == bVar10);
      auVar31[8] = -(cStack_210 == cVar33);
      auVar31[9] = -(cStack_20f == cVar34);
      auVar31[10] = -(cStack_20e == cVar35);
      auVar31[0xb] = -(bStack_20d == bVar10);
      auVar31[0xc] = -(cStack_20c == cVar33);
      auVar31[0xd] = -(cStack_20b == cVar34);
      auVar31[0xe] = -(cStack_20a == cVar35);
      auVar31[0xf] = -(bVar12 == bVar10);
      uVar15 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe);
      bStack_209 = bVar12;
      if (uVar15 != 0) {
        local_3a8 = CONCAT17(bVar10,CONCAT16(cVar35,CONCAT15(cVar34,CONCAT14(cVar33,uVar8))));
        pcVar24 = pbVar28[2]._M_str;
        do {
          uVar5 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          args._M_extent_value = (size_t)sv;
          bVar11 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              this_00,sv,
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              (pcVar24 + (ulong)uVar5 * 0x48 + (long)pCVar23 * 0x438));
          sVar26 = sVar27;
          pbVar20 = (basic_string_view<char,_std::char_traits<char>_> *)
                    (pcVar24 + (ulong)uVar5 * 0x48 + (long)pCVar23 * 0x438);
          local_390 = pCVar23;
          if (bVar11) goto LAB_00294aa1;
          uVar15 = uVar15 - 1 & uVar15;
        } while (uVar15 != 0);
        bVar12 = *(byte *)(sVar3 + (long)pCVar23 * 0x10 + 0xf);
      }
      sVar7._M_str = local_368._M_str;
      sVar7._M_len = local_368._M_len;
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & bVar12) == 0) break;
      pcVar24 = pcVar22 + (long)((long)&((DefinitionLookupResult *)&pCVar23->liblist)->definition +
                                1);
      pcVar22 = pcVar22 + 1;
      pCVar23 = (ConfigRule *)((ulong)pcVar24 & (ulong)pbVar28[1]._M_str);
      local_368 = sVar7;
    } while (pcVar22 <= pbVar28[1]._M_str);
  }
LAB_00294fff:
  SmallVectorBase<const_slang::ast::Symbol_*>::cleanup
            (&parentStack.super_SmallVectorBase<const_slang::ast::Symbol_*>,(EVP_PKEY_CTX *)pCVar23)
  ;
LAB_0029500c:
  if (defResult.configRoot == (ConfigBlockSymbol *)0x0) {
    SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
    ::cleanup((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
               *)&defResult,(EVP_PKEY_CTX *)pCVar23);
    pSVar16 = (context->scope).ptr;
LAB_00295077:
    sVar49 = defName;
    SVar47 = parsing::Token::range(this);
    Compilation::getDefinition(&defResult,comp,sVar49,pSVar16,SVar47,(DiagCode)0xcf0006);
    fromSyntax::anon_class_72_9_2532bcb6::operator()
              (&createInstances,&defResult,(HierarchicalInstanceSyntax *)0x0);
  }
  else {
    defResult_00 = (ConfigRule *)defResult.definition;
    for (lVar29 = (long)defResult.configRoot << 5; lVar29 != 0; lVar29 = lVar29 + -0x20) {
      pCVar23 = defResult_00;
      fromSyntax::anon_class_72_9_2532bcb6::operator()
                (&createInstances,(DefinitionLookupResult *)defResult_00,
                 (HierarchicalInstanceSyntax *)(defResult_00->useCell).lib._M_len);
      defResult_00 = (ConfigRule *)&(defResult_00->useCell).lib._M_str;
    }
    SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
    ::cleanup((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
               *)&defResult,(EVP_PKEY_CTX *)pCVar23);
  }
  goto LAB_002950e8;
}

Assistant:

void InstanceSymbol::fromSyntax(Compilation& comp, const HierarchyInstantiationSyntax& syntax,
                                const ASTContext& context, SmallVectorBase<const Symbol*>& results,
                                SmallVectorBase<const Symbol*>& implicitNets,
                                const BindDirectiveInfo* bindInfo,
                                const SyntaxNode* overrideSyntax) {
    auto defName = syntax.type.valueText();
    TimeTraceScope timeScope("createInstances"sv, [&] { return std::string(defName); });

    // Find our parent instance, if there is one.
    bitmask<InstanceFlags> flags;
    bool inChecker = false;
    const InstanceBodySymbol* parentInst = nullptr;
    const Scope* currScope = context.scope;
    do {
        auto& sym = currScope->asSymbol();
        if (sym.kind == SymbolKind::InstanceBody) {
            parentInst = &sym.as<InstanceBodySymbol>();
            flags |= parentInst->flags & ~InstanceFlags::FromBind;
            break;
        }

        if (sym.kind == SymbolKind::CheckerInstanceBody) {
            auto& body = sym.as<CheckerInstanceBodySymbol>();
            inChecker = true;
            flags |= body.flags & ~InstanceFlags::FromBind;
            currScope = body.parentInstance->getParentScope();
            continue;
        }

        if (sym.kind == SymbolKind::GenerateBlock) {
            if (sym.as<GenerateBlockSymbol>().isUninstantiated)
                flags |= InstanceFlags::Uninstantiated;
        }
        currScope = sym.getParentScope();
    } while (currScope);

    // If this instance is not instantiated then we'll just fill in a placeholder
    // and move on. This is likely inside an untaken generate branch.
    if (flags.has(InstanceFlags::Uninstantiated)) {
        UninstantiatedDefSymbol::fromSyntax(comp, syntax, context, results, implicitNets);
        return;
    }

    if (bindInfo)
        flags |= InstanceFlags::FromBind;

    // Unfortunately this instantiation could be for a checker instead of a
    // module/interface/program, so we're forced to do a real name lookup here
    // in the local scope before doing a global definition lookup.
    if (auto sym = Lookup::unqualified(*context.scope, defName, LookupFlags::AllowDeclaredAfter)) {
        if (sym->kind == SymbolKind::Checker) {
            CheckerInstanceSymbol::fromSyntax(sym->as<CheckerSymbol>(), syntax, context, results,
                                              implicitNets, flags);
            return;
        }
    }

    const DefinitionSymbol* owningDefinition = nullptr;
    const HierarchyOverrideNode* parentOverrideNode = nullptr;
    const ResolvedConfig* resolvedConfig = nullptr;
    if (parentInst) {
        owningDefinition = &parentInst->getDefinition();

        // In the uncommon case that our parent instance has an override
        // node set, we need to go back and make sure we account for any
        // generate blocks that might actually be along the parent path for
        // the new instances we're creating.
        if (parentInst->hierarchyOverrideNode)
            parentOverrideNode = findParentOverrideNode(*context.scope);

        // Check if our parent has a configuration applied. If so, and if
        // that configuration has instance overrides, we need to check if
        // any of them apply to the instances we're about to create.
        if (parentInst->parentInstance)
            resolvedConfig = parentInst->parentInstance->resolvedConfig;

        if (flags.has(InstanceFlags::FromBind)) {
            if (flags.has(InstanceFlags::ParentFromBind)) {
                context.addDiag(diag::BindUnderBind, syntax.type.range());
                return;
            }

            // If our parent is from a bind statement, pass down the flag
            // so that we prevent further binds below us too.
            flags |= InstanceFlags::ParentFromBind;
        }
    }

    InstanceBuilder builder(context, implicitNets, parentOverrideNode, syntax.attributes, flags,
                            overrideSyntax);

    // Creates instance symbols -- if specificInstance is provided then only that
    // instance will be created, otherwise all instances in the original syntax
    // node will be created in one go.
    auto createInstances = [&](const Compilation::DefinitionLookupResult& defResult,
                               const HierarchicalInstanceSyntax* specificInstance) {
        auto def = defResult.definition;
        if (!def) {
            UninstantiatedDefSymbol::fromSyntax(comp, syntax, specificInstance, context, results,
                                                implicitNets, builder.implicitNetNames,
                                                builder.netType);
            return;
        }

        auto confRule = defResult.configRule;
        auto addDiag = [&](DiagCode code) -> Diagnostic& {
            if (confRule) {
                SLANG_ASSERT(specificInstance);
                auto& diag = context.addDiag(code, specificInstance->sourceRange());
                diag.addNote(diag::NoteConfigRule, confRule->syntax->sourceRange());
                return diag;
            }
            else {
                auto& diag = context.addDiag(code, syntax.type.range());
                if (specificInstance)
                    diag << specificInstance->sourceRange();
                return diag;
            }
        };

        if (def->kind == SymbolKind::Primitive) {
            PrimitiveInstanceSymbol::fromSyntax(def->as<PrimitiveSymbol>(), syntax,
                                                specificInstance, context, results, implicitNets,
                                                builder.implicitNetNames);
            if (!results.empty()) {
                if (!owningDefinition ||
                    owningDefinition->definitionKind != DefinitionKind::Module || inChecker) {
                    addDiag(diag::InvalidPrimInstanceForParent);
                }
                else if (confRule && confRule->paramOverrides) {
                    addDiag(diag::ConfigParamsForPrimitive);
                }
            }
            return;
        }

        auto& definition = def->as<DefinitionSymbol>();
        definition.noteInstantiated();

        if (inChecker) {
            addDiag(diag::InvalidInstanceForParent)
                << definition.getArticleKindString() << "a checker"sv;
        }
        else if (owningDefinition) {
            auto owningKind = owningDefinition->definitionKind;
            if (owningKind == DefinitionKind::Program ||
                (owningKind == DefinitionKind::Interface &&
                 definition.definitionKind == DefinitionKind::Module)) {
                addDiag(diag::InvalidInstanceForParent) << definition.getArticleKindString()
                                                        << owningDefinition->getArticleKindString();
            }
        }

        ParameterBuilder paramBuilder(*context.scope, definition.name, definition.parameters);
        if (syntax.parameters)
            paramBuilder.setAssignments(*syntax.parameters, /* isFromConfig */ false);

        auto localConfig = resolvedConfig;
        if (confRule) {
            SLANG_ASSERT(resolvedConfig);
            auto rc = comp.emplace<ResolvedConfig>(*resolvedConfig);
            rc->configRule = confRule;

            confRule->isUsed = true;
            if (confRule->liblist)
                rc->liblist = *confRule->liblist;
            localConfig = rc;

            if (confRule->paramOverrides) {
                paramBuilder.setConfigScope(rc->useConfig);
                paramBuilder.setAssignments(*confRule->paramOverrides, /* isFromConfig */ true);
            }
        }

        builder.reset(definition, paramBuilder, localConfig, defResult.configRoot);

        if (specificInstance) {
            results.push_back(builder.create(*specificInstance));
        }
        else {
            // NOLINTNEXTLINE
            for (auto instanceSyntax : syntax.instances)
                results.push_back(builder.create(*instanceSyntax));
        }
    };

    // If we came here from a bind directive we need to make use
    // of the definition / config info that has already been resolved.
    if (bindInfo) {
        auto defResult = comp.getDefinition(defName, *context.scope, syntax.type.range(),
                                            *bindInfo);
        if (defResult.configRoot) {
            SLANG_ASSERT(parentInst && parentInst->parentInstance);
            auto rc = comp.emplace<ResolvedConfig>(*defResult.configRoot,
                                                   *parentInst->parentInstance);
            resolvedConfig = rc;

            if (!bindInfo->isNewConfigRoot) {
                // This is not a new config root, so normally we'd use our parent's
                // config. For binds though we don't know the right parent scope
                // because it's the scope that contains the bind directive, not the
                // one that contains the instance, so recreate it here.
                defResult.configRoot = nullptr;
                rc->liblist = bindInfo->liblist;
            }
        }

        createInstances(defResult, nullptr);
        return;
    }

    if (resolvedConfig) {
        ResolvedInstanceRules instanceRules;
        resolveInstanceOverrides(*resolvedConfig, context, syntax, defName, diag::UnknownModule,
                                 instanceRules);
        if (!instanceRules.empty()) {
            for (auto& [defResult, instSyntax] : instanceRules)
                createInstances(defResult, instSyntax);
            return;
        }
    }

    // Simple case: look up the definition and create all instances in one go.
    auto defResult = comp.getDefinition(defName, *context.scope, syntax.type.range(),
                                        diag::UnknownModule);
    createInstances(defResult, nullptr);
}